

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

RAMReport * __thiscall
celero::RAMReport::operator-(RAMReport *__return_storage_ptr__,RAMReport *this,RAMReport *x)

{
  RAMReport *r;
  RAMReport *x_local;
  RAMReport *this_local;
  
  RAMReport(__return_storage_ptr__);
  __return_storage_ptr__->RamSystemTotal = this->RamSystemTotal - x->RamSystemTotal;
  __return_storage_ptr__->RamSystemAvailable = this->RamSystemAvailable - x->RamSystemAvailable;
  __return_storage_ptr__->RamSystemUsed = this->RamSystemUsed - x->RamSystemUsed;
  __return_storage_ptr__->RamSystemUsedByCurrentProcess =
       this->RamSystemUsedByCurrentProcess - x->RamSystemUsedByCurrentProcess;
  __return_storage_ptr__->RamPhysicalTotal = this->RamPhysicalTotal - x->RamPhysicalTotal;
  __return_storage_ptr__->RamPhysicalAvailable =
       this->RamPhysicalAvailable - x->RamPhysicalAvailable;
  __return_storage_ptr__->RamPhysicalUsed = this->RamPhysicalUsed - x->RamPhysicalUsed;
  __return_storage_ptr__->RamPhysicalUsedByCurrentProcess =
       this->RamPhysicalUsedByCurrentProcess - x->RamPhysicalUsedByCurrentProcess;
  __return_storage_ptr__->RamPhysicalUsedByCurrentProcessPeak =
       this->RamPhysicalUsedByCurrentProcessPeak - x->RamPhysicalUsedByCurrentProcessPeak;
  __return_storage_ptr__->RamVirtualTotal = this->RamVirtualTotal - x->RamVirtualTotal;
  __return_storage_ptr__->RamVirtualAvailable = this->RamVirtualAvailable - x->RamVirtualAvailable;
  __return_storage_ptr__->RamVirtualUsed = this->RamVirtualUsed - x->RamVirtualUsed;
  __return_storage_ptr__->RamVirtualUsedByCurrentProcess =
       this->RamVirtualUsedByCurrentProcess - x->RamVirtualUsedByCurrentProcess;
  return __return_storage_ptr__;
}

Assistant:

celero::RAMReport celero::RAMReport::operator-(const RAMReport& x)
{
	celero::RAMReport r;
	r.RamSystemTotal = this->RamSystemTotal - x.RamSystemTotal;
	r.RamSystemAvailable = this->RamSystemAvailable - x.RamSystemAvailable;
	r.RamSystemUsed = this->RamSystemUsed - x.RamSystemUsed;
	r.RamSystemUsedByCurrentProcess = this->RamSystemUsedByCurrentProcess - x.RamSystemUsedByCurrentProcess;
	r.RamPhysicalTotal = this->RamPhysicalTotal - x.RamPhysicalTotal;
	r.RamPhysicalAvailable = this->RamPhysicalAvailable - x.RamPhysicalAvailable;
	r.RamPhysicalUsed = this->RamPhysicalUsed - x.RamPhysicalUsed;
	r.RamPhysicalUsedByCurrentProcess = this->RamPhysicalUsedByCurrentProcess - x.RamPhysicalUsedByCurrentProcess;
	r.RamPhysicalUsedByCurrentProcessPeak = this->RamPhysicalUsedByCurrentProcessPeak - x.RamPhysicalUsedByCurrentProcessPeak;
	r.RamVirtualTotal = this->RamVirtualTotal - x.RamVirtualTotal;
	r.RamVirtualAvailable = this->RamVirtualAvailable - x.RamVirtualAvailable;
	r.RamVirtualUsed = this->RamVirtualUsed - x.RamVirtualUsed;
	r.RamVirtualUsedByCurrentProcess = this->RamVirtualUsedByCurrentProcess - x.RamVirtualUsedByCurrentProcess;

	return r;
}